

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_7::Validator::CheckModule(Validator *this,Module *module)

{
  ModuleFieldList *pMVar1;
  ModuleField **ppMVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Import *base;
  Var *pVVar5;
  ModuleField *pMVar6;
  bool bVar7;
  bool bVar8;
  Result RVar9;
  reference pMVar10;
  FuncModuleField *pFVar11;
  MemoryModuleField *pMVar12;
  GlobalModuleField *pGVar13;
  StartModuleField *pSVar14;
  ExceptionModuleField *pEVar15;
  ImportModuleField *pIVar16;
  FuncImport *pFVar17;
  ExportModuleField *pEVar18;
  TableModuleField *pTVar19;
  ExceptionImport *pEVar20;
  MemoryImport *pMVar21;
  GlobalImport *pGVar22;
  TableImport *pTVar23;
  Memory *memory;
  Exception *except;
  Table *table;
  Location *loc;
  Var *var;
  Var *pVVar24;
  const_iterator rhs;
  const_iterator rhs_00;
  const_iterator rhs_01;
  undefined1 local_b8 [8];
  const_iterator __begin2;
  Func *start_func;
  ModuleFieldList *__range2;
  
  this->current_module_ = module;
  pMVar1 = &module->fields;
  this->current_except_index_ = 0;
  this->current_table_index_ = 0;
  this->current_memory_index_ = 0;
  this->current_global_index_ = 0;
  this->num_imported_globals_ = 0;
  __begin2.list_ = (intrusive_list<wabt::ModuleField> *)(module->fields).first_;
  bVar8 = false;
  local_b8 = (undefined1  [8])pMVar1;
  do {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = pMVar1;
    bVar7 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)local_b8,rhs);
    pMVar6 = (ModuleField *)pMVar1;
    if (!bVar7) {
      while( true ) {
        __begin2.node_ = pMVar6;
        rhs_00.node_ = (ModuleField *)0x0;
        rhs_00.list_ = pMVar1;
        bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                          ((const_iterator *)&__begin2.node_,rhs_00);
        if (!bVar8) break;
        pMVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&__begin2.node_);
        if (pMVar10->type_ == ElemSegment) {
          pVVar5 = (Var *)pMVar10[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
          for (pVVar24 = (Var *)pMVar10[3].super_intrusive_list_base<wabt::ModuleField>.next_;
              pVVar24 != pVVar5; pVVar24 = pVVar24 + 1) {
            CheckFuncVar(this,pVVar24,(Func **)0x0);
          }
          if ((pMVar10[2].loc.field_1.field2[0] == '\0') &&
             (RVar9 = CheckTableVar(this,(Var *)&pMVar10[1].loc.filename.size_,(Table **)local_b8),
             RVar9.enum_ != Error)) {
            CheckConstInitExpr(this,&pMVar10->loc,(ExprList *)((long)&pMVar10[2].loc.field_1 + 8),
                               I32,"elem segment offset");
          }
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++
                  ((const_iterator *)&__begin2.node_);
        pMVar6 = __begin2.node_;
      }
      ppMVar2 = &__begin2.node_;
      __begin2.node_ = (ModuleField *)pMVar1;
      while (rhs_01.node_ = (ModuleField *)0x0, rhs_01.list_ = pMVar1,
            bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                              ((const_iterator *)ppMVar2,rhs_01), bVar8) {
        pMVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)ppMVar2);
        if (((pMVar10->type_ == DataSegment) && (pMVar10[2].loc.field_1.field2[0] == '\0')) &&
           (RVar9 = CheckMemoryVar(this,(Var *)&pMVar10[1].loc.filename.size_,(Memory **)local_b8),
           RVar9.enum_ != Error)) {
          CheckConstInitExpr(this,&pMVar10->loc,(ExprList *)((long)&pMVar10[2].loc.field_1 + 8),I32,
                             "data segment offset");
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)ppMVar2);
      }
      __begin2.node_ = (ModuleField *)this;
      BindingHash::FindDuplicates(&module->export_bindings,(DuplicateCallback *)&__begin2.node_);
      std::_Function_base::~_Function_base((_Function_base *)&__begin2.node_);
      return (Result)(this->result_).enum_;
    }
    pMVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)local_b8);
    switch(pMVar10->type_) {
    case Func:
      loc = &pMVar10->loc;
      pFVar11 = cast<wabt::FuncModuleField,wabt::ModuleField>(pMVar10);
      this->current_func_ = &pFVar11->func;
      CheckFuncSignature(this,loc,&(pFVar11->func).decl);
      if (((this->options_->features).multi_value_enabled_ == false) &&
         (((long)*(pointer *)
                  ((long)&(pFVar11->func).decl.sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data + 8) -
           (long)(pFVar11->func).decl.sig.result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffff8U) != 0)) {
        PrintError(this,loc,"multiple result values not currently supported.");
      }
      else {
        this->expr_loc_ = loc;
        TypeChecker::BeginFunction(&this->typechecker_,&(pFVar11->func).decl.sig.result_types);
        ppMVar2 = &__begin2.node_;
        ExprVisitor::ExprVisitor((ExprVisitor *)ppMVar2,&this->super_Delegate);
        ExprVisitor::VisitExprList((ExprVisitor *)ppMVar2,&(pFVar11->func).exprs);
        ExprVisitor::~ExprVisitor((ExprVisitor *)ppMVar2);
        TypeChecker::EndFunction(&this->typechecker_);
        this->current_func_ = (Func *)0x0;
      }
      break;
    case Global:
      pGVar13 = cast<wabt::GlobalModuleField,wabt::ModuleField>(pMVar10);
      CheckConstInitExpr(this,&pMVar10->loc,&(pGVar13->global).init_expr,(pGVar13->global).type,
                         "global initializer expression");
      this->current_global_index_ = this->current_global_index_ + 1;
      break;
    case Import:
      pIVar16 = cast<wabt::ImportModuleField,wabt::ModuleField>(pMVar10);
      base = (pIVar16->import)._M_t.
             super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
             super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl;
      if (base->kind_ < (Except|Table)) {
        switch(base->kind_) {
        case First:
          pFVar17 = cast<wabt::FuncImport,wabt::Import>(base);
          if ((pFVar17->func).decl.has_func_type == true) {
            CheckFuncTypeVar(this,&(pFVar17->func).decl.type_var,(FuncType **)0x0);
          }
          break;
        case Table:
          pTVar23 = cast<wabt::TableImport,wabt::Import>(base);
          table = &pTVar23->table;
          goto LAB_00da12c9;
        case Memory:
          pMVar21 = cast<wabt::MemoryImport,wabt::Import>(base);
          memory = &pMVar21->memory;
          goto LAB_00da10f2;
        case Global:
          pGVar22 = cast<wabt::GlobalImport,wabt::Import>(base);
          if (((pGVar22->global).mutable_ == true) &&
             ((this->options_->features).mutable_globals_enabled_ == false)) {
            PrintError(this,&pMVar10->loc,"mutable globals cannot be imported");
          }
          uVar3 = this->current_global_index_;
          uVar4 = this->num_imported_globals_;
          this->current_global_index_ = uVar3 + 1;
          this->num_imported_globals_ = uVar4 + 1;
          break;
        case Except:
          this->current_except_index_ = this->current_except_index_ + 1;
          pEVar20 = cast<wabt::ExceptionImport,wabt::Import>(base);
          except = &pEVar20->except;
          goto LAB_00da1212;
        }
      }
      break;
    case Export:
      pEVar18 = cast<wabt::ExportModuleField,wabt::ModuleField>(pMVar10);
      switch((pEVar18->export_).kind) {
      case First:
        CheckFuncVar(this,&(pEVar18->export_).var,(Func **)0x0);
        break;
      case Table:
        CheckTableVar(this,&(pEVar18->export_).var,(Table **)0x0);
        break;
      case Memory:
        CheckMemoryVar(this,&(pEVar18->export_).var,(Memory **)0x0);
        break;
      case Global:
        pVVar24 = &(pEVar18->export_).var;
        RVar9 = CheckGlobalVar(this,pVVar24,(Global **)&__begin2.node_,(Index *)0x0);
        if (((RVar9.enum_ == Ok) &&
            (*(char *)((long)&((__begin2.node_)->loc).filename.size_ + 4) == '\x01')) &&
           ((this->options_->features).mutable_globals_enabled_ == false)) {
          PrintError(this,&pVVar24->loc,"mutable globals cannot be exported");
        }
        break;
      case Except:
        CheckExceptVar(this,&(pEVar18->export_).var,(Exception **)0x0);
      }
      break;
    case Table:
      pTVar19 = cast<wabt::TableModuleField,wabt::ModuleField>(pMVar10);
      table = &pTVar19->table;
LAB_00da12c9:
      CheckTable(this,&pMVar10->loc,table);
      this->current_table_index_ = this->current_table_index_ + 1;
      break;
    case Memory:
      pMVar12 = cast<wabt::MemoryModuleField,wabt::ModuleField>(pMVar10);
      memory = &pMVar12->memory;
LAB_00da10f2:
      CheckMemory(this,&pMVar10->loc,memory);
      this->current_memory_index_ = this->current_memory_index_ + 1;
      break;
    case Start:
      if (bVar8) {
        PrintError(this,&pMVar10->loc,"only one start function allowed");
      }
      __begin2.node_ = (ModuleField *)0x0;
      pSVar14 = cast<wabt::StartModuleField,wabt::ModuleField>(pMVar10);
      CheckFuncVar(this,&pSVar14->start,(Func **)&__begin2.node_);
      if (__begin2.node_ != (ModuleField *)0x0) {
        if ((*(long *)&__begin2.node_[1].type_ - *(long *)((long)&__begin2.node_[1].loc.field_1 + 8)
            & 0x3fffffffcU) != 0) {
          PrintError(this,&pMVar10->loc,"start function must be nullary");
        }
        if (((long)__begin2.node_[2].super_intrusive_list_base<wabt::ModuleField>.prev_ -
             (long)__begin2.node_[2].super_intrusive_list_base<wabt::ModuleField>.next_ &
            0x3fffffffcU) != 0) {
          PrintError(this,&pMVar10->loc,"start function must not return anything");
        }
      }
      bVar8 = true;
      break;
    case Except:
      this->current_except_index_ = this->current_except_index_ + 1;
      pEVar15 = cast<wabt::ExceptionModuleField,wabt::ModuleField>(pMVar10);
      except = &pEVar15->except;
LAB_00da1212:
      CheckExcept(this,&pMVar10->loc,except);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)local_b8);
  } while( true );
}

Assistant:

Result Validator::CheckModule(const Module* module) {
  bool seen_start = false;

  current_module_ = module;
  current_table_index_ = 0;
  current_memory_index_ = 0;
  current_global_index_ = 0;
  num_imported_globals_ = 0;
  current_except_index_ = 0;

  for (const ModuleField& field : module->fields) {
    switch (field.type()) {
      case ModuleFieldType::Except:
        ++current_except_index_;
        CheckExcept(&field.loc, &cast<ExceptionModuleField>(&field)->except);
        break;

      case ModuleFieldType::Func:
        CheckFunc(&field.loc, &cast<FuncModuleField>(&field)->func);
        break;

      case ModuleFieldType::Global:
        CheckGlobal(&field.loc, &cast<GlobalModuleField>(&field)->global);
        current_global_index_++;
        break;

      case ModuleFieldType::Import:
        CheckImport(&field.loc, cast<ImportModuleField>(&field)->import.get());
        break;

      case ModuleFieldType::Export:
        CheckExport(&field.loc, &cast<ExportModuleField>(&field)->export_);
        break;

      case ModuleFieldType::Table:
        CheckTable(&field.loc, &cast<TableModuleField>(&field)->table);
        current_table_index_++;
        break;

      case ModuleFieldType::ElemSegment:
        // Checked below.
        break;

      case ModuleFieldType::Memory:
        CheckMemory(&field.loc, &cast<MemoryModuleField>(&field)->memory);
        current_memory_index_++;
        break;

      case ModuleFieldType::DataSegment:
        // Checked below.
        break;

      case ModuleFieldType::FuncType:
        break;

      case ModuleFieldType::Start: {
        if (seen_start) {
          PrintError(&field.loc, "only one start function allowed");
        }

        const Func* start_func = nullptr;
        CheckFuncVar(&cast<StartModuleField>(&field)->start, &start_func);
        if (start_func) {
          if (start_func->GetNumParams() != 0) {
            PrintError(&field.loc, "start function must be nullary");
          }

          if (start_func->GetNumResults() != 0) {
            PrintError(&field.loc, "start function must not return anything");
          }
        }
        seen_start = true;
        break;
      }
    }
  }

  CheckElemSegments(module);
  CheckDataSegments(module);
  CheckDuplicateExportBindings(module);

  return result_;
}